

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O1

void __thiscall OpenMD::GofRTheta::processHistogram(GofRTheta *this)

{
  int iVar1;
  int iVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  RealType RVar11;
  double dVar12;
  double dVar13;
  
  iVar1 = (this->super_GofRAngle).super_RadialDistrFunc.nPairs_;
  RVar11 = Snapshot::getVolume(((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.
                               info_)->sman_->currentSnapshot_);
  pvVar3 = (this->super_GofRAngle).histogram_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->super_GofRAngle).histogram_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3;
  if (lVar7 != 0) {
    iVar2 = (this->super_GofRAngle).nAngleBins_;
    uVar6 = (lVar7 >> 3) * -0x5555555555555555;
    pvVar4 = (this->super_GofRAngle).avgGofr_.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      lVar7 = *(long *)&pvVar3[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      lVar9 = (long)*(pointer *)
                     ((long)&pvVar3[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8) - lVar7;
      if (lVar9 != 0) {
        dVar13 = (this->super_GofRAngle).deltaR_;
        dVar12 = (double)(uVar8 & 0xffffffff) * dVar13;
        dVar13 = dVar13 + dVar12;
        lVar5 = *(long *)&pvVar4[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar10 = 0;
        do {
          *(double *)(lVar5 + uVar10 * 8) =
               (double)*(int *)(lVar7 + uVar10 * 4) /
               ((dVar13 * dVar13 * dVar13 - dVar12 * dVar12 * dVar12) *
               ((((double)iVar1 / RVar11) * 12.566370614359172) / ((double)iVar2 * 3.0))) +
               *(double *)(lVar5 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while ((uVar10 & 0xffffffff) < (ulong)(lVar9 >> 2));
      }
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) <= uVar6 && uVar6 - (uVar8 & 0xffffffff) != 0);
  }
  return;
}

Assistant:

void GofRTheta::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity = nPairs / volume;
    RealType pairConstant =
        (4.0 * Constants::PI * pairDensity) / (3.0 * (double)nAngleBins_);

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          (rUpper * rUpper * rUpper) - (rLower * rLower * rLower);
      RealType nIdeal = volSlice * pairConstant;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }